

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void RunControlFlowOptimization(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  SynBase **ppSVar1;
  uint *optCount;
  VmInstruction **ppVVar2;
  SmallArray<VmValue_*,_4U> *pSVar3;
  VmBlock *pVVar4;
  VmValue *pVVar5;
  bool bVar6;
  uint uVar7;
  VmInstructionType VVar8;
  VmValue **ppVVar9;
  VmInstruction **ppVVar10;
  VmInstruction *instruction;
  uint i;
  VmInstruction *pVVar11;
  VmInstruction *pVVar12;
  VmValue *pVVar13;
  VmBlock **ppVVar14;
  VmBlock *pVVar15;
  VmInstruction **ppVVar16;
  VmValue *pVVar17;
  VmValue *pVVar18;
  
  if ((value != (VmValue *)0x0) && (value->typeID == 4)) {
    ppSVar1 = &value[1].source;
    optCount = &module->controlFlowSimplifications;
    ppVVar14 = (VmBlock **)ppSVar1;
LAB_0025528d:
    pVVar4 = *ppVVar14;
    if (pVVar4 != (VmBlock *)0x0) {
      ppVVar2 = &pVVar4->firstInstruction;
      ppVVar16 = ppVVar2;
      while (pVVar12 = *ppVVar16, pVVar12 != (VmInstruction *)0x0) {
        uVar7 = pVVar12->cmd - VM_INST_JUMP;
        if ((uVar7 < 0x31) && ((0x1100000000037U >> ((ulong)uVar7 & 0x3f) & 1) != 0))
        goto LAB_002552da;
        ppVVar16 = &pVVar12->nextSibling;
      }
      instruction = pVVar4->lastInstruction;
      goto LAB_002552f4;
    }
    pVVar4 = (VmBlock *)*ppSVar1;
    while (pVVar15 = pVVar4, pVVar15 != (VmBlock *)0x0) {
      pVVar4 = pVVar15->nextSibling;
      pVVar12 = pVVar15->firstInstruction;
      if ((((pVVar12 != (VmInstruction *)0x0) && (pVVar12 == pVVar15->lastInstruction)) &&
          (pVVar12->cmd == VM_INST_JUMP)) && (pVVar15 != (VmBlock *)*ppSVar1)) {
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,0);
        pVVar18 = *ppVVar9;
        if ((pVVar18 == (VmValue *)0x0) || (pVVar18->typeID != 3)) {
          __assert_fail("target",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1450,
                        "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                       );
        }
        for (uVar7 = 0; uVar7 < (pVVar15->super_VmValue).users.count; uVar7 = uVar7 + 1) {
          ppVVar9 = SmallArray<VmValue_*,_8U>::operator[](&(pVVar15->super_VmValue).users,uVar7);
          pVVar5 = *ppVVar9;
          if (((pVVar5 != (VmValue *)0x0) && (pVVar5->typeID == 2)) &&
             (*(int *)&pVVar5[1]._vptr_VmValue == 0x4d)) goto LAB_002558a0;
        }
        anon_unknown.dwarf_20a43d::ReplaceValueUsersWith
                  (module,&pVVar15->super_VmValue,pVVar18,optCount);
      }
LAB_002558a0:
      if (((pVVar15->super_VmValue).users.count == 0) &&
         (bVar6 = VmBlock::HasExternalInstructionUsers(pVVar15), !bVar6)) {
        VmFunction::RemoveBlock((VmFunction *)value,pVVar15);
        *optCount = *optCount + 1;
      }
    }
  }
  return;
LAB_002552da:
  while ((instruction = pVVar4->lastInstruction, instruction != (VmInstruction *)0x0 &&
         (instruction != pVVar12))) {
    *optCount = *optCount + 1;
    VmBlock::RemoveInstruction(pVVar4,instruction);
  }
LAB_002552f4:
  if (instruction == (VmInstruction *)0x0) goto LAB_00255628;
  if ((((instruction->cmd == VM_INST_JUMP) &&
       (pVVar15 = pVVar4->nextSibling, pVVar15 != (VmBlock *)0x0)) &&
      (ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,0),
      (VmBlock *)*ppVVar9 == pVVar15)) &&
     (((pVVar15->super_VmValue).users.count == 1 &&
      (ppVVar9 = SmallArray<VmValue_*,_8U>::operator[](&(pVVar15->super_VmValue).users,0),
      (VmInstruction *)*ppVVar9 == instruction)))) {
    ppVVar16 = &pVVar15->firstInstruction;
    pVVar12 = pVVar15->firstInstruction;
LAB_00255368:
    do {
      pVVar11 = pVVar12;
      ppVVar10 = ppVVar16;
      if (pVVar11 == (VmInstruction *)0x0) goto LAB_002553d6;
      pVVar12 = pVVar11->nextSibling;
      if (pVVar11->cmd == VM_INST_PHI) {
        if ((pVVar11->arguments).count == 2) {
          ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar11->arguments,1);
          if ((VmBlock *)*ppVVar9 == pVVar4) {
            ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar11->arguments,0);
            anon_unknown.dwarf_20a43d::ReplaceValueUsersWith
                      (module,&pVVar11->super_VmValue,*ppVVar9,optCount);
            goto LAB_00255368;
          }
        }
        __assert_fail("inst->arguments.size() == 2 && inst->arguments[1] == curr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x13c6,
                      "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)")
        ;
      }
    } while( true );
  }
LAB_0025543b:
  if (instruction->cmd - VM_INST_JUMP_Z < 2) {
    pVVar15 = pVVar4->nextSibling;
    pSVar3 = &instruction->arguments;
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](pSVar3,2);
    if ((VmBlock *)*ppVVar9 == pVVar15) {
      ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](pSVar3,1);
      pVVar18 = *ppVVar9;
      ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](pSVar3,2);
      pVVar5 = *ppVVar9;
      instruction->cmd = (instruction->cmd == VM_INST_JUMP_Z) + VM_INST_JUMP_Z;
      ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](pSVar3,1);
      *ppVVar9 = pVVar5;
      ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](pSVar3,2);
      *ppVVar9 = pVVar18;
      *optCount = *optCount + 1;
    }
  }
  VVar8 = instruction->cmd;
  if (VVar8 - VM_INST_JUMP_Z < 2) {
    pSVar3 = &instruction->arguments;
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](pSVar3,0);
    pVVar12 = (VmInstruction *)*ppVVar9;
    if ((pVVar12 == (VmInstruction *)0x0) || ((pVVar12->super_VmValue).typeID != 2)) {
      pVVar12 = (VmInstruction *)0x0;
    }
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](pSVar3,1);
    pVVar18 = *ppVVar9;
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](pSVar3,2);
    if ((((pVVar12 != (VmInstruction *)0x0) && (pVVar12->cmd == VM_INST_PHI)) &&
        (pVVar12 == instruction->prevSibling)) && (pVVar12 == *ppVVar2)) {
      pVVar5 = *ppVVar9;
      for (uVar7 = 0; uVar7 < (pVVar12->arguments).count; uVar7 = uVar7 + 2) {
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,uVar7);
        pVVar17 = *ppVVar9;
        if ((pVVar17 == (VmValue *)0x0) || (pVVar17->typeID != 2)) {
          pVVar17 = (VmValue *)0x0;
        }
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,uVar7 + 1);
        pVVar13 = *ppVVar9;
        if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 3)) {
          pVVar13 = (VmValue *)0x0;
        }
        if (*(int *)&pVVar17[1]._vptr_VmValue == 7) {
          ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]
                              ((SmallArray<VmValue_*,_4U> *)&pVVar17[1].typeID,0);
          pVVar17 = pVVar5;
          if ((instruction->cmd == VM_INST_JUMP_NZ) != (*(int *)&(*ppVVar9)[1]._vptr_VmValue == 0))
          {
            pVVar17 = pVVar18;
          }
          pVVar13 = *(VmValue **)&pVVar13[1].hasSideEffects;
          if (*(int *)&pVVar13[1]._vptr_VmValue == 0x1c) {
            ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&pVVar13[1].typeID,0);
            if ((VmBlock *)*ppVVar9 != pVVar4) {
              __assert_fail("terminator->arguments[0] == curr",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x1412,
                            "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            ppVVar9 = SmallArray<VmValue_*,_4U>::operator[]
                                ((SmallArray<VmValue_*,_4U> *)&pVVar13[1].typeID,0);
            anon_unknown.dwarf_20a43d::ReplaceValue(module,pVVar13,*ppVVar9,pVVar17);
            module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
          }
        }
      }
    }
    VVar8 = instruction->cmd;
  }
  if ((VVar8 == VM_INST_RETURN) && ((instruction->arguments).count != 0)) {
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,0);
    pVVar12 = (VmInstruction *)*ppVVar9;
    if (((pVVar12 != (VmInstruction *)0x0) &&
        ((((pVVar12->super_VmValue).typeID == 2 && (pVVar12->cmd == VM_INST_PHI)) &&
         (pVVar12 == instruction->prevSibling)))) && (pVVar12 == *ppVVar2)) {
      for (uVar7 = 0; uVar7 < (pVVar12->arguments).count; uVar7 = uVar7 + 2) {
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,uVar7);
        pVVar18 = *ppVVar9;
        if ((pVVar18 == (VmValue *)0x0) || (pVVar18->typeID != 2)) {
          pVVar18 = (VmValue *)0x0;
        }
        ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar12->arguments,uVar7 + 1);
        pVVar11 = *(VmInstruction **)&(*ppVVar9)[1].hasSideEffects;
        if (pVVar11->cmd == VM_INST_JUMP) {
          ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&pVVar11->arguments,0);
          if ((VmBlock *)*ppVVar9 != pVVar4) {
            __assert_fail("terminator->arguments[0] == curr",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x142c,
                          "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          anon_unknown.dwarf_20a43d::ChangeInstructionTo
                    (module,pVVar11,VM_INST_RETURN,pVVar18,(VmValue *)0x0,(VmValue *)0x0,
                     (VmValue *)0x0,(VmValue *)0x0,optCount);
        }
      }
    }
  }
  VVar8 = instruction->cmd;
  if (VVar8 - VM_INST_JUMP_Z < 2) {
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,1);
    pVVar18 = *ppVVar9;
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,2);
    if (pVVar18 == *ppVVar9) {
      anon_unknown.dwarf_20a43d::ChangeInstructionTo
                (module,instruction,VM_INST_JUMP,pVVar18,(VmValue *)0x0,(VmValue *)0x0,
                 (VmValue *)0x0,(VmValue *)0x0,optCount);
    }
    VVar8 = instruction->cmd;
  }
  if ((VVar8 == VM_INST_UNYIELD) && ((instruction->arguments).count == 2)) {
    ppVVar9 = SmallArray<VmValue_*,_4U>::operator[](&instruction->arguments,1);
    anon_unknown.dwarf_20a43d::ChangeInstructionTo
              (module,instruction,VM_INST_JUMP,*ppVVar9,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0
               ,(VmValue *)0x0,optCount);
  }
LAB_00255628:
  ppVVar14 = &pVVar4->nextSibling;
  goto LAB_0025528d;
LAB_002553d6:
  while (pVVar12 = *ppVVar10, pVVar12 != (VmInstruction *)0x0) {
    pVVar12->parent = pVVar4;
    ppVVar10 = &pVVar12->nextSibling;
  }
  pVVar12 = pVVar4->lastInstruction;
  pVVar11 = *ppVVar16;
  if (pVVar12 != (VmInstruction *)0x0) {
    pVVar12->nextSibling = pVVar11;
  }
  if (pVVar11 != (VmInstruction *)0x0) {
    pVVar11->prevSibling = pVVar12;
    pVVar4->lastInstruction = pVVar15->lastInstruction;
  }
  *ppVVar16 = (VmInstruction *)0x0;
  pVVar15->lastInstruction = (VmInstruction *)0x0;
  if (instruction->parent != (VmBlock *)0x0) {
    VmBlock::RemoveInstruction(pVVar4,instruction);
  }
  *optCount = *optCount + 1;
  goto LAB_0025543b;
}

Assistant:

void RunControlFlowOptimization(ExpressionContext &ctx, VmModule *module, VmValue *value)
{
	(void)ctx;

	if(VmFunction *function = getType<VmFunction>(value))
	{
		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		{
			// Remove any instructions after a branch
			for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
			{
				if(IsBlockTerminator(inst->cmd))
				{
					while(curr->lastInstruction && curr->lastInstruction != inst)
					{
						module->controlFlowSimplifications++;

						curr->RemoveInstruction(curr->lastInstruction);
					}
					break;
				}
			}

			// Merge together blocks if a block A ends with a branch to block B and block B only incoming blocks is block A
			VmInstruction *currLastInst = curr->lastInstruction;

			if(currLastInst && currLastInst->cmd == VM_INST_JUMP)
			{
				VmBlock *next = curr->nextSibling;

				if(next && currLastInst->arguments[0] == next && next->users.size() == 1 && next->users[0] == currLastInst)
				{
					// Fixup phi instructions
					for(VmInstruction *inst = next->firstInstruction; inst;)
					{
						VmInstruction *nextInst = inst->nextSibling;

						if(inst->cmd == VM_INST_PHI)
						{
							// Check that phi only expects us to come from the block we are merging with
							assert(inst->arguments.size() == 2 && inst->arguments[1] == curr);

							ReplaceValueUsersWith(module, inst, inst->arguments[0], &module->controlFlowSimplifications);
						}

						inst = nextInst;
					}

					// Steal target block instructions
					for(VmInstruction *inst = next->firstInstruction; inst; inst = inst->nextSibling)
						inst->parent = curr;

					if(curr->lastInstruction)
						curr->lastInstruction->nextSibling = next->firstInstruction;

					if(next->firstInstruction)
					{
						next->firstInstruction->prevSibling = curr->lastInstruction;

						curr->lastInstruction = next->lastInstruction;
					}

					next->firstInstruction = next->lastInstruction = NULL;

					// Remove branch
					if(currLastInst->parent)
						curr->RemoveInstruction(currLastInst);

					module->controlFlowSimplifications++;
				}
			}

			// Reverse conditional branch so that the false block jump will jump further than the true block jump
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmBlock *next = curr->nextSibling;

				if(currLastInst->arguments[2] == next)
				{
					VmValue *trueBlock = currLastInst->arguments[1];
					VmValue *falseBlock = currLastInst->arguments[2];

					currLastInst->cmd = currLastInst->cmd == VM_INST_JUMP_Z ? VM_INST_JUMP_NZ : VM_INST_JUMP_Z;

					currLastInst->arguments[1] = falseBlock;
					currLastInst->arguments[2] = trueBlock;

					module->controlFlowSimplifications++;
				}
			}

			// If block contains a single conditional jump, and the condition is a phi node with constant arguments, try to redirect predecessor to our target
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmInstruction *phi = getType<VmInstruction>(currLastInst->arguments[0]);
				VmValue *trueBlock = currLastInst->arguments[1];
				VmValue *falseBlock = currLastInst->arguments[2];

				if(phi && phi->cmd == VM_INST_PHI && phi == currLastInst->prevSibling && phi == curr->firstInstruction)
				{
					for(unsigned i = 0; i < phi->arguments.size(); i += 2)
					{
						VmInstruction *option = getType<VmInstruction>(phi->arguments[i]);
						VmBlock *edge = getType<VmBlock>(phi->arguments[i + 1]);

						if(option->cmd != VM_INST_LOAD_IMMEDIATE)
							continue;

						VmConstant *condition = getType<VmConstant>(option->arguments[0]);

						VmValue *target = condition->iValue != 0 ? (currLastInst->cmd == VM_INST_JUMP_NZ ? trueBlock : falseBlock) : (currLastInst->cmd == VM_INST_JUMP_NZ ? falseBlock : trueBlock);

						VmInstruction *terminator = edge->lastInstruction;

						if(terminator->cmd == VM_INST_JUMP)
						{
							assert(terminator->arguments[0] == curr);

							ReplaceValue(module, terminator, terminator->arguments[0], target);

							module->controlFlowSimplifications++;
						}
					}
				}
			}

			// If block contains a return, and the return value is a phi node with constant arguments, try to return directly from predecessors
			if(currLastInst && currLastInst->cmd == VM_INST_RETURN && !currLastInst->arguments.empty())
			{
				VmInstruction *phi = getType<VmInstruction>(currLastInst->arguments[0]);

				if(phi && phi->cmd == VM_INST_PHI && phi == currLastInst->prevSibling && phi == curr->firstInstruction)
				{
					for(unsigned i = 0; i < phi->arguments.size(); i += 2)
					{
						VmInstruction *option = getType<VmInstruction>(phi->arguments[i]);
						VmBlock *edge = getType<VmBlock>(phi->arguments[i + 1]);

						VmInstruction *terminator = edge->lastInstruction;

						if(terminator->cmd == VM_INST_JUMP)
						{
							assert(terminator->arguments[0] == curr);

							ChangeInstructionTo(module, terminator, VM_INST_RETURN, option, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
						}
					}
				}
			}

			// Reverse conditional jump with unconditional if both targets are the same
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmValue *trueBlock = currLastInst->arguments[1];
				VmValue *falseBlock = currLastInst->arguments[2];

				if(trueBlock == falseBlock)
					ChangeInstructionTo(module, currLastInst, VM_INST_JUMP, trueBlock, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
			}

			// Remove coroutine unyield that only contains a single target
			if(currLastInst && currLastInst->cmd == VM_INST_UNYIELD && currLastInst->arguments.size() == 2)
			{
				VmValue *targetBlock = currLastInst->arguments[1];

				ChangeInstructionTo(module, currLastInst, VM_INST_JUMP, targetBlock, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
			}
		}

		for(VmBlock *curr = function->firstBlock; curr;)
		{
			VmBlock *next = curr->nextSibling;

			if(curr->firstInstruction && curr->firstInstruction == curr->lastInstruction && curr->firstInstruction->cmd == VM_INST_JUMP && curr != function->firstBlock)
			{
				// Remove blocks that only contain an unconditional branch to some other block
				VmBlock *target = getType<VmBlock>(curr->firstInstruction->arguments[0]);

				assert(target);

				// Do not replace block if it is an incoming phi instruction argument
				bool hasPhiUser = false;

				for(unsigned i = 0; i < curr->users.size(); i++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(curr->users[i]))
					{
						if(inst->cmd == VM_INST_PHI)
						{
							hasPhiUser = true;
							break;
						}
					}
				}

				if(!hasPhiUser)
					ReplaceValueUsersWith(module, curr, target, &module->controlFlowSimplifications);
			}

			if(curr->users.empty() && !curr->HasExternalInstructionUsers())
			{
				// Remove unused blocks
				function->RemoveBlock(curr);

				module->controlFlowSimplifications++;
			}

			curr = next;
		}
	}
}